

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::get_integeri_v(NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  GLuint local_1c;
  GLuint local_18;
  GLint maxShaderStorageBufferBindings;
  GLint maxUniformBufferBindings;
  GLint data;
  NegativeTestContext *ctx_local;
  
  maxShaderStorageBufferBindings = -1;
  local_18 = 0;
  local_1c = 0;
  _maxUniformBufferBindings = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"GL_INVALID_ENUM is generated if name is not an accepted value.",
             &local_41);
  NegativeTestContext::beginSection(ctx,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glGetIntegeri_v
            (&_maxUniformBufferBindings->super_CallLogWrapper,0xffffffff,0,
             &maxShaderStorageBufferBindings);
  NegativeTestContext::expectError(_maxUniformBufferBindings,0x500);
  NegativeTestContext::endSection(_maxUniformBufferBindings);
  pNVar1 = _maxUniformBufferBindings;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "GL_INVALID_VALUE is generated if index is outside of the valid range for the indexed state target."
             ,&local_79);
  NegativeTestContext::beginSection(pNVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  glu::CallLogWrapper::glGetIntegerv
            (&_maxUniformBufferBindings->super_CallLogWrapper,0x8a2f,(GLint *)&local_18);
  NegativeTestContext::expectError(_maxUniformBufferBindings,0);
  glu::CallLogWrapper::glGetIntegeri_v
            (&_maxUniformBufferBindings->super_CallLogWrapper,0x8a28,local_18,
             &maxShaderStorageBufferBindings);
  NegativeTestContext::expectError(_maxUniformBufferBindings,0x501);
  NegativeTestContext::endSection(_maxUniformBufferBindings);
  pNVar1 = _maxUniformBufferBindings;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,
             "GL_INVALID_VALUE is generated if index is outside of the valid range for the indexed state target."
             ,&local_a1);
  NegativeTestContext::beginSection(pNVar1,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  glu::CallLogWrapper::glGetIntegerv
            (&_maxUniformBufferBindings->super_CallLogWrapper,0x90dd,(GLint *)&local_1c);
  NegativeTestContext::expectError(_maxUniformBufferBindings,0);
  glu::CallLogWrapper::glGetIntegeri_v
            (&_maxUniformBufferBindings->super_CallLogWrapper,0x90d3,local_1c,
             &maxShaderStorageBufferBindings);
  NegativeTestContext::expectError(_maxUniformBufferBindings,0x501);
  NegativeTestContext::endSection(_maxUniformBufferBindings);
  return;
}

Assistant:

void get_integeri_v (NegativeTestContext& ctx)
{
	GLint data								= -1;
	GLint maxUniformBufferBindings			=  0;
	GLint maxShaderStorageBufferBindings	=  0;

	ctx.beginSection("GL_INVALID_ENUM is generated if name is not an accepted value.");
	ctx.glGetIntegeri_v(-1, 0, &data);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if index is outside of the valid range for the indexed state target.");
	ctx.glGetIntegerv(GL_MAX_UNIFORM_BUFFER_BINDINGS, &maxUniformBufferBindings);
	ctx.expectError(GL_NO_ERROR);
	ctx.glGetIntegeri_v(GL_UNIFORM_BUFFER_BINDING, maxUniformBufferBindings, &data);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if index is outside of the valid range for the indexed state target.");
	ctx.glGetIntegerv(GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS, &maxShaderStorageBufferBindings);
	ctx.expectError(GL_NO_ERROR);
	ctx.glGetIntegeri_v(GL_SHADER_STORAGE_BUFFER_BINDING, maxShaderStorageBufferBindings, &data);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}